

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

void nk_insert_window(nk_context *ctx,nk_window *win,nk_window_insert_location loc)

{
  byte *pbVar1;
  nk_window *pnVar2;
  nk_window *pnVar3;
  nk_window **ppnVar4;
  nk_window **ppnVar5;
  nk_window *end;
  
  if (win != (nk_window *)0x0) {
    ppnVar4 = &ctx->begin;
    ppnVar5 = ppnVar4;
    do {
      pnVar2 = *ppnVar5;
      if (pnVar2 == (nk_window *)0x0) {
        pnVar2 = *ppnVar4;
        if (pnVar2 != (nk_window *)0x0) {
          pnVar3 = ctx->end;
          pnVar3->flags = pnVar3->flags | 0x800;
          if (loc == NK_INSERT_BACK) {
            pnVar3->next = win;
            win->prev = pnVar3;
            win->next = (nk_window *)0x0;
            ctx->end = win;
            ppnVar4 = &ctx->active;
          }
          else {
            pnVar2->prev = win;
            win->next = pnVar2;
            win->prev = (nk_window *)0x0;
          }
          *ppnVar4 = win;
          pbVar1 = (byte *)((long)&win->flags + 1);
          *pbVar1 = *pbVar1 & 0xf7;
          ctx->count = ctx->count + 1;
          return;
        }
        win->next = (nk_window *)0x0;
        win->prev = (nk_window *)0x0;
        ctx->begin = win;
        ctx->end = win;
        ctx->count = 1;
        return;
      }
      ppnVar5 = &pnVar2->next;
    } while (pnVar2 != win);
  }
  return;
}

Assistant:

NK_INTERN void
nk_insert_window(struct nk_context *ctx, struct nk_window *win,
    enum nk_window_insert_location loc)
{
    const struct nk_window *iter;
    NK_ASSERT(ctx);
    NK_ASSERT(win);
    if (!win || !ctx) return;

    iter = ctx->begin;
    while (iter) {
        NK_ASSERT(iter != iter->next);
        NK_ASSERT(iter != win);
        if (iter == win) return;
        iter = iter->next;
    }

    if (!ctx->begin) {
        win->next = 0;
        win->prev = 0;
        ctx->begin = win;
        ctx->end = win;
        ctx->count = 1;
        return;
    }
    if (loc == NK_INSERT_BACK) {
        struct nk_window *end;
        end = ctx->end;
        end->flags |= NK_WINDOW_ROM;
        end->next = win;
        win->prev = ctx->end;
        win->next = 0;
        ctx->end = win;
        ctx->active = ctx->end;
        ctx->end->flags &= ~(nk_flags)NK_WINDOW_ROM;
    } else {
        ctx->end->flags |= NK_WINDOW_ROM;
        ctx->begin->prev = win;
        win->next = ctx->begin;
        win->prev = 0;
        ctx->begin = win;
        ctx->begin->flags &= ~(nk_flags)NK_WINDOW_ROM;
    }
    ctx->count++;
}